

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::RemoveRPath(string *file,string *emsg,bool *removed)

{
  void *pvVar1;
  bool bVar2;
  StringEntry *__tmp;
  StringEntry *pSVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  long lVar6;
  long *plVar7;
  ulong uVar8;
  char *pcVar9;
  unsigned_long *puVar10;
  pointer ppVar11;
  pointer ppVar12;
  byte unaff_R13B;
  byte bVar13;
  pointer pcVar14;
  long lVar15;
  bool bVar16;
  DynamicEntryList dentries;
  StringEntry *se [2];
  unsigned_long zeroSize [2];
  unsigned_long zeroPosition [2];
  ofstream f;
  pointer local_2d0;
  uint local_2bc;
  DynamicEntryList local_2b0;
  StringEntry *local_298 [3];
  string *local_280;
  pointer local_278;
  pointer local_270;
  unsigned_long local_268 [4];
  vector<char,_std::allocator<char>_> local_248;
  undefined1 local_230 [32];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  if (removed != (bool *)0x0) {
    *removed = false;
  }
  local_268[2] = 0;
  local_268[3] = 0;
  local_268[0] = 0;
  local_268[1] = 0;
  cmELF::cmELF((cmELF *)local_230,(file->_M_dataplus)._M_p);
  bVar2 = cmELF::Valid((cmELF *)local_230);
  if (bVar2) {
    local_298[0] = (StringEntry *)0x0;
    local_298[1] = (StringEntry *)0x0;
    pSVar3 = cmELF::GetRPath((cmELF *)local_230);
    bVar16 = pSVar3 != (StringEntry *)0x0;
    if (bVar16) {
      local_298[0] = pSVar3;
    }
    local_2bc = (uint)bVar16;
    pSVar3 = cmELF::GetRunPath((cmELF *)local_230);
    if (pSVar3 != (StringEntry *)0x0) {
      local_2bc = local_2bc + 1;
      local_298[bVar16] = pSVar3;
    }
    pSVar3 = local_298[0];
    if (local_2bc == 2) {
      if (local_298[1]->IndexInSection < local_298[0]->IndexInSection) {
        local_298[0] = local_298[1];
        local_298[1] = pSVar3;
      }
LAB_00117c9b:
      cmELF::GetDynamicEntries(&local_2b0,(cmELF *)local_230);
      local_270 = (pointer)CONCAT71(local_2b0.
                                    super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    local_2b0.
                                    super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_1_);
      local_278 = local_2b0.
                  super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_280 = file;
      if (local_270 ==
          local_2b0.
          super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (emsg == (string *)0x0) {
          pcVar14 = (pointer)0x0;
          local_2d0 = (pointer)0x0;
          uVar4 = 0;
          local_2bc = 0;
        }
        else {
          pcVar14 = (pointer)0x0;
          std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x25de51);
          local_2d0 = (pointer)0x0;
          uVar4 = 0;
          local_2bc = 0;
        }
      }
      else {
        if (local_2bc != 0) {
          uVar8 = 0;
          do {
            pSVar3 = local_298[uVar8];
            local_268[uVar8 + 2] = pSVar3->Position;
            local_268[uVar8] = pSVar3->Size;
            uVar8 = uVar8 + 1;
          } while (local_2bc != uVar8);
        }
        uVar4 = cmELF::GetDynamicEntryPosition((cmELF *)local_230,1);
        uVar5 = cmELF::GetDynamicEntryPosition((cmELF *)local_230,0);
        ppVar12 = (pointer)CONCAT71(local_2b0.
                                    super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    local_2b0.
                                    super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_1_);
        if (ppVar12 !=
            local_2b0.
            super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          lVar15 = 0;
          do {
            lVar6 = ppVar12->first;
            if (lVar6 != 0x1d && lVar6 != 0xf) {
              ppVar11 = ppVar12;
              do {
                ppVar12 = ppVar11 + 1;
                if ((lVar6 == 0x70000035) && (bVar16 = cmELF::IsMIPS((cmELF *)local_230), bVar16)) {
                  ppVar11->second = ppVar11->second + lVar15 * (uVar4 - uVar5);
                }
                if (ppVar12 ==
                    local_2b0.
                    super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00117e25;
                lVar6 = ppVar12->first;
              } while ((lVar6 != 0xf) && (ppVar11 = ppVar12, lVar6 != 0x1d));
            }
            if ((ppVar12 + 1 !=
                 local_2b0.
                 super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
               (lVar6 = (long)local_2b0.
                              super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)(ppVar12 + 1) >> 4,
               0 < lVar6)) {
              uVar8 = lVar6 + 1;
              puVar10 = &ppVar12[1].second;
              do {
                puVar10[-3] = ((pair<long,_unsigned_long> *)(puVar10 + -1))->first;
                puVar10[-2] = *puVar10;
                uVar8 = uVar8 - 1;
                puVar10 = puVar10 + 2;
              } while (1 < uVar8);
            }
            local_2b0.
            super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_2b0.
                 super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
            lVar15 = lVar15 + 1;
          } while (ppVar12 !=
                   local_2b0.
                   super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
LAB_00117e25:
        cmELF::EncodeDynamicEntries(&local_248,(cmELF *)local_230,&local_2b0);
        local_2d0 = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        uVar4 = cmELF::GetDynamicEntryPosition((cmELF *)local_230,0);
        pcVar14 = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      }
      pvVar1 = (void *)CONCAT71(local_2b0.
                                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                local_2b0.
                                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_1_);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,(long)local_2b0.
                                     super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar1);
      }
      cmELF::~cmELF((cmELF *)local_230);
      if (local_270 == local_278) {
        unaff_R13B = 0;
      }
      else {
        std::ofstream::ofstream(local_230,(local_280->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
        if ((abStack_210
             [(long)(((cmELFInternal *)(local_230._0_8_ + -0x58))->DynamicSectionStrings)._M_t.
                    _M_impl.super__Rb_tree_header._M_header._M_left] & 5) == 0) {
          plVar7 = (long *)std::ostream::seekp(local_230,uVar4,0);
          if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0) {
            plVar7 = (long *)std::ostream::write(local_230,(long)local_2d0);
            if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0) {
              if (local_2bc != 0) {
                uVar8 = 0;
                do {
                  plVar7 = (long *)std::ostream::seekp((ostream *)local_230,local_268[uVar8 + 2],0);
                  if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
                    if (emsg == (string *)0x0) {
LAB_00118136:
                      unaff_R13B = 0;
                      goto LAB_001180b5;
                    }
                    pcVar9 = "Error seeking to RPATH position.";
LAB_001180a9:
                    std::__cxx11::string::operator=((string *)emsg,pcVar9);
                    goto LAB_001180b2;
                  }
                  for (uVar4 = local_268[uVar8]; uVar4 != 0; uVar4 = uVar4 - 1) {
                    local_2b0.
                    super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_230,(char *)&local_2b0,1);
                  }
                  if ((abStack_210[(long)*(_Base_ptr *)(local_230._0_8_ + -0x18)] & 5) != 0) {
                    if (emsg == (string *)0x0) goto LAB_00118136;
                    pcVar9 = "Error writing the empty rpath string to the file.";
                    goto LAB_001180a9;
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar8 != local_2bc);
              }
              unaff_R13B = 1;
              if (removed != (bool *)0x0) {
                *removed = true;
              }
              goto LAB_001180b5;
            }
            if (emsg == (string *)0x0) goto LAB_001180b2;
            pcVar9 = "Error replacing DYNAMIC table header.";
          }
          else {
            if (emsg == (string *)0x0) goto LAB_001180b2;
            pcVar9 = "Error seeking to DYNAMIC table header for RPATH.";
          }
LAB_00117fcd:
          unaff_R13B = 0;
          std::__cxx11::string::_M_replace
                    ((ulong)emsg,0,(char *)emsg->_M_string_length,(ulong)pcVar9);
        }
        else {
          if (emsg != (string *)0x0) {
            pcVar9 = "Error opening file for update.";
            goto LAB_00117fcd;
          }
LAB_001180b2:
          unaff_R13B = 0;
        }
LAB_001180b5:
        local_230._0_8_ = _VTT;
        *(undefined8 *)
         (local_230 +
         (long)_VTT[-1].DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
             = _vtable;
        std::filebuf::~filebuf((filebuf *)(local_230 + 8));
        std::ios_base::~ios_base(local_138);
      }
      if (local_2d0 != (pointer)0x0) {
        operator_delete(local_2d0,(long)pcVar14 - (long)local_2d0);
      }
      goto LAB_00118104;
    }
    if (local_2bc != 0) goto LAB_00117c9b;
    cmELF::~cmELF((cmELF *)local_230);
  }
  else {
    cmELF::~cmELF((cmELF *)local_230);
LAB_00118104:
    if (removed == (bool *)0x0 || bVar2) {
      bVar13 = unaff_R13B | !bVar2;
      goto LAB_0011811d;
    }
    *removed = false;
  }
  bVar13 = 1;
LAB_0011811d:
  return (bool)(bVar13 & 1);
}

Assistant:

bool cmSystemTools::RemoveRPath(std::string const& file, std::string* emsg,
                                bool* removed)
{
  if (cm::optional<bool> result = RemoveRPathELF(file, emsg, removed)) {
    return result.value();
  }
  if (cm::optional<bool> result = RemoveRPathXCOFF(file, emsg, removed)) {
    return result.value();
  }
  // The file format is not recognized.  Assume it has no RPATH.
  return true;
}